

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Message * __thiscall
google::protobuf::Reflection::GetMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  uint uVar1;
  int number;
  CppType CVar2;
  Descriptor *message_type;
  MessageLite *pMVar3;
  Message **ppMVar4;
  undefined8 *puVar5;
  Message *pMVar6;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetMessage",
               "Field is repeated; the method requires a singular field.");
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetMessage",CPPTYPE_MESSAGE);
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    if (factory == (MessageFactory *)0x0) {
      factory = this->message_factory_;
    }
    uVar1 = (this->schema_).extensions_offset_;
    number = *(int *)(field + 0x44);
    message_type = FieldDescriptor::message_type(field);
    pMVar3 = internal::ExtensionSet::GetMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),
                        number,message_type,factory);
    return (Message *)pMVar3;
  }
  ppMVar4 = GetRaw<google::protobuf::Message_const*>(this,message,field);
  pMVar6 = *ppMVar4;
  if (pMVar6 == (Message *)0x0) {
    puVar5 = (undefined8 *)internal::ReflectionSchema::GetFieldDefault(&this->schema_,field);
    pMVar6 = (Message *)*puVar5;
  }
  return pMVar6;
}

Assistant:

const Message& Reflection::GetMessage(const Message& message,
                                      const FieldDescriptor* field,
                                      MessageFactory* factory) const {
  USAGE_CHECK_ALL(GetMessage, SINGULAR, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<const Message&>(GetExtensionSet(message).GetMessage(
        field->number(), field->message_type(), factory));
  } else {
    const Message* result = GetRaw<const Message*>(message, field);
    if (result == nullptr) {
      result = DefaultRaw<const Message*>(field);
    }
    return *result;
  }
}